

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv__free(void *ptr)

{
  int iVar1;
  int *piVar2;
  int saved_errno;
  void *ptr_local;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  (*uv__allocator.local_free)(ptr);
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return;
}

Assistant:

void uv__free(void* ptr) {
  int saved_errno;

  /* Libuv expects that free() does not clobber errno.  The system allocator
   * honors that assumption but custom allocators may not be so careful.
   */
  saved_errno = errno;
  uv__allocator.local_free(ptr);
  errno = saved_errno;
}